

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O1

TargetImageWidget * __thiscall TargetImageWidget::GetImageInViewTargetArea(TargetImageWidget *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TargetImageWidget *in_RSI;
  QPainter p;
  QPointF QStack_28;
  double local_18;
  
  QImage::QImage((QImage *)this,0x1000,0x1000,Format_RGB32);
  QPainter::QPainter((QPainter *)&QStack_28,(QPaintDevice *)this);
  lVar1 = *(long *)&(in_RSI->super_PanAndZoomWidget).field_0x20;
  iVar2 = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  iVar3 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  QPainter::scale(4096.0 / (double)iVar3,4096.0 / (double)iVar3);
  lVar1 = *(long *)&(in_RSI->super_PanAndZoomWidget).field_0x20;
  iVar2 = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  iVar4 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  iVar3 = iVar2;
  if (iVar4 < iVar2) {
    iVar3 = iVar4;
  }
  QStack_28.yp = ((double)iVar2 - (double)iVar3) * -0.5;
  local_18 = ((double)iVar4 - (double)iVar3) * -0.5;
  QPainter::translate(&QStack_28);
  PaintImage(in_RSI,(QPainter *)&QStack_28);
  QPainter::~QPainter((QPainter *)&QStack_28);
  return this;
}

Assistant:

QImage TargetImageWidget::GetImageInViewTargetArea() const
{
    const qreal rgbImageSize = 4096;
    QImage allRgbTarget(rgbImageSize, rgbImageSize, QImage::Format_RGB32);

    /*
     *  Our widget isn't 4096*4096, but we've aligned our image to this widget,
     *  so now we need to further scale our painter to account for this
     *  difference.
     */
    QPainter p(&allRgbTarget);
    qreal edge = std::min(width(), height());
    qreal scale = rgbImageSize / edge;
    p.scale(scale, scale);
    p.translate(-GetTargetRect().topLeft());

    PaintImage(p);

    return allRgbTarget;
}